

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O2

void __thiscall
PackageMempoolAcceptResult::PackageMempoolAcceptResult
          (PackageMempoolAcceptResult *this,uint256 *wtxid,MempoolAcceptResult *result)

{
  long in_FS_OFFSET;
  initializer_list<std::pair<const_uint256,_MempoolAcceptResult>_> __l;
  allocator_type local_12a;
  less<uint256> local_129;
  pair<const_uint256,_MempoolAcceptResult> local_128;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ValidationState<PackageValidationResult>::ValidationState
            ((ValidationState<PackageValidationResult> *)this);
  local_128.first.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(wtxid->super_base_blob<256U>).m_data._M_elems;
  local_128.first.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((wtxid->super_base_blob<256U>).m_data._M_elems + 8);
  local_128.first.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((wtxid->super_base_blob<256U>).m_data._M_elems + 0x10);
  local_128.first.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((wtxid->super_base_blob<256U>).m_data._M_elems + 0x18);
  MempoolAcceptResult::MempoolAcceptResult(&local_128.second,result);
  __l._M_len = 1;
  __l._M_array = &local_128;
  std::
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::map(&this->m_tx_results,__l,&local_129,&local_12a);
  MempoolAcceptResult::~MempoolAcceptResult(&local_128.second);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit PackageMempoolAcceptResult(const uint256& wtxid, const MempoolAcceptResult& result)
        : m_tx_results{ {wtxid, result} } {}